

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicDispatchIndirect::RunIteration
          (BasicDispatchIndirect *this,GLintptr offset,GLuint buffer_size)

{
  void *pvVar1;
  GLuint buffer;
  ulong uVar2;
  CallLogWrapper *this_00;
  bool bVar3;
  GLuint i;
  ulong uVar4;
  ulong __n;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  
  __n = (ulong)buffer_size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&data,__n,&local_49);
  buffer = this->m_storage_buffer;
  if (buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    buffer = this->m_storage_buffer;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glDispatchComputeIndirect(this_00,offset);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  pvVar1 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,__n * 4,1);
  bVar3 = true;
  for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = (ulong)*(uint *)((long)pvVar1 + uVar4 * 4);
    if (uVar4 != uVar2) {
      bVar3 = false;
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",uVar4 & 0xffffffff,uVar2,
                 uVar4 & 0xffffffff);
    }
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar3;
}

Assistant:

bool RunIteration(GLintptr offset, GLuint buffer_size)
	{
		std::vector<GLuint> data(buffer_size);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * buffer_size, &data[0], GL_DYNAMIC_DRAW);

		glDispatchComputeIndirect(offset);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* result;
		result = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * buffer_size, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < buffer_size; ++i)
		{
			if (result[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, result[i], i);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}